

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
              BINDING **bindingsPtr)

{
  long lVar1;
  char cVar2;
  XML_Char *pXVar3;
  BINDING *pBVar4;
  BINDING *pBVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  lVar1 = 0;
  do {
    lVar6 = lVar1;
    lVar1 = lVar6 + 1;
  } while (uri[lVar6] != '\0');
  cVar2 = *(char *)((long)parser + 0x488);
  uVar9 = (lVar6 - (ulong)(cVar2 == '\0')) + 1;
  pBVar4 = *(BINDING **)((long)parser + 1000);
  iVar8 = (int)uVar9;
  if (pBVar4 == (BINDING *)0x0) {
    pBVar4 = (BINDING *)(**(code **)((long)parser + 0x18))(0x30);
    if (pBVar4 != (BINDING *)0x0) {
      uVar7 = (lVar1 - (ulong)(cVar2 == '\0')) + 0x18;
      pXVar3 = (XML_Char *)(**(code **)((long)parser + 0x18))(uVar7 & 0xffffffff);
      pBVar4->uri = pXVar3;
      if (pXVar3 != (XML_Char *)0x0) {
        pBVar4->uriAlloc = (int)uVar7;
        goto LAB_004ca8d9;
      }
      (**(code **)((long)parser + 0x28))(pBVar4);
    }
LAB_004ca977:
    iVar8 = 0;
  }
  else {
    if (pBVar4->uriAlloc < iVar8) {
      uVar7 = (lVar1 - (ulong)(cVar2 == '\0')) + 0x18;
      pXVar3 = (XML_Char *)(**(code **)((long)parser + 0x20))(pBVar4->uri,uVar7 & 0xffffffff);
      pBVar4->uri = pXVar3;
      if (pXVar3 == (XML_Char *)0x0) goto LAB_004ca977;
      pBVar4->uriAlloc = (int)uVar7;
    }
    *(binding **)((long)parser + 1000) = pBVar4->nextTagBinding;
LAB_004ca8d9:
    pBVar4->uriLen = iVar8;
    uVar9 = uVar9 & 0xffffffff;
    memcpy(pBVar4->uri,uri,uVar9);
    if (*(char *)((long)parser + 0x488) != '\0') {
      pBVar4->uri[uVar9 - 1] = *(char *)((long)parser + 0x488);
    }
    pBVar4->prefix = prefix;
    pBVar4->attId = attId;
    pBVar4->prevPrefixBinding = prefix->binding;
    pBVar5 = (BINDING *)0x0;
    if ((PREFIX *)((long)parser + 0x390) != prefix) {
      pBVar5 = pBVar4;
    }
    if (*uri != '\0') {
      pBVar5 = pBVar4;
    }
    prefix->binding = pBVar5;
    pBVar4->nextTagBinding = *bindingsPtr;
    *bindingsPtr = pBVar4;
    iVar8 = 1;
    if (*(code **)((long)parser + 200) != (code *)0x0) {
      if (prefix->binding == (BINDING *)0x0) {
        uri = (XML_Char *)0x0;
      }
      (**(code **)((long)parser + 200))(*(undefined8 *)((long)parser + 8),prefix->name,uri);
    }
  }
  return iVar8;
}

Assistant:

static
int addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId, const XML_Char *uri, BINDING **bindingsPtr)
{
  BINDING *b;
  int len;
  for (len = 0; uri[len]; len++)
    ;
  if (namespaceSeparator)
    len++;
  if (freeBindingList) {
    b = freeBindingList;
    if (len > b->uriAlloc) {
      b->uri = REALLOC(b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (!b->uri)
        return 0;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    freeBindingList = b->nextTagBinding;
  }
  else {
    b = MALLOC(sizeof(BINDING));
    if (!b)
      return 0;
    b->uri = MALLOC(sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (!b->uri) {
      FREE(b);
      return 0;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (namespaceSeparator)
    b->uri[len - 1] = namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  if (*uri == XML_T('\0') && prefix == &dtd.defaultPrefix)
    prefix->binding = 0;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  if (startNamespaceDeclHandler)
    startNamespaceDeclHandler(handlerArg, prefix->name,
                              prefix->binding ? uri : 0);
  return 1;
}